

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::SetArgs(cmake *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  size_type sVar6;
  long lVar7;
  ulong uVar8;
  const_reference pvVar9;
  char *pcVar10;
  ostream *poVar11;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 collapse;
  string local_268;
  string local_248;
  cmListFileBacktrace local_228;
  allocator<char> local_209;
  string local_208;
  byte local_1e2;
  byte local_1e1;
  undefined1 local_1e0 [6];
  bool haveBinaryDir;
  bool haveSourceDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [8];
  string kdevError;
  cmGlobalGenerator *gen;
  string value_2;
  string value_1;
  string value;
  string file;
  undefined1 local_d8 [8];
  string path_2;
  undefined1 local_98 [8];
  string path_1;
  undefined1 local_48 [8];
  string path;
  string *arg;
  uint i;
  bool havePlatform;
  bool haveToolset;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  bVar3 = false;
  bVar2 = false;
  arg._0_4_ = 1;
  do {
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar6 <= (uint)arg) {
      GetHomeDirectory_abi_cxx11_(this);
      bVar4 = std::__cxx11::string::empty();
      local_1e1 = (bVar4 ^ 0xff) & 1;
      GetHomeOutputDirectory_abi_cxx11_(this);
      bVar4 = std::__cxx11::string::empty();
      local_1e2 = (bVar4 ^ 0xff) & 1;
      collapse = extraout_DL;
      if (((this->CurrentWorkingMode == NORMAL_MODE) && ((local_1e1 & 1) == 0)) && (local_1e2 == 0))
      {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,
                   "No source or binary directory provided. Both will be assumed to be the same as the current working directory, but note that this warning will become a fatal error in future CMake releases."
                   ,&local_209);
        local_228.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_228.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmListFileBacktrace::cmListFileBacktrace(&local_228);
        IssueMessage(this,WARNING,&local_208,&local_228);
        cmListFileBacktrace::~cmListFileBacktrace(&local_228);
        std::__cxx11::string::~string((string *)&local_208);
        std::allocator<char>::~allocator(&local_209);
        collapse = extraout_DL_00;
      }
      if ((local_1e1 & 1) == 0) {
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  (&local_248,(SystemTools *)0x1,(bool)collapse);
        SetHomeDirectory(this,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        collapse = extraout_DL_01;
      }
      if ((local_1e2 & 1) == 0) {
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  (&local_268,(SystemTools *)0x1,(bool)collapse);
        SetHomeOutputDirectory(this,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
      }
      return;
    }
    path.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](args,(ulong)(uint)arg);
    lVar7 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8505cd);
    if ((lVar7 == 0) ||
       (lVar7 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x85f876), lVar7 == 0)) {
      std::__cxx11::string::substr((ulong)local_48,path.field_2._8_8_);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
LAB_00386cb5:
        cmsys::SystemTools::CollapseFullPath
                  ((string *)((long)&path_1.field_2 + 8),(string *)local_48);
        std::__cxx11::string::operator=
                  ((string *)local_48,(string *)(path_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(path_1.field_2._M_local_buf + 8));
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_48);
        SetHomeDirectory(this,(string *)local_48);
        bVar1 = false;
      }
      else {
        arg._0_4_ = (uint)arg + 1;
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args);
        if ((uint)arg < sVar6) {
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)(uint)arg);
          std::__cxx11::string::operator=((string *)local_48,(string *)pvVar9);
          pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
          if (*pcVar10 != '-') goto LAB_00386cb5;
          cmSystemTools::Error
                    ("No source directory specified for -S",(char *)0x0,(char *)0x0,(char *)0x0);
          bVar1 = true;
        }
        else {
          cmSystemTools::Error
                    ("No source directory specified for -S",(char *)0x0,(char *)0x0,(char *)0x0);
          bVar1 = true;
        }
      }
      std::__cxx11::string::~string((string *)local_48);
      if (bVar1) {
        return;
      }
    }
    else {
      lVar7 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8453a2);
      if (lVar7 != 0) {
        lVar7 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x85f89a);
        if (lVar7 == 0) {
          std::__cxx11::string::substr((ulong)local_98,path.field_2._8_8_);
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
LAB_00386e72:
            cmsys::SystemTools::CollapseFullPath
                      ((string *)((long)&path_2.field_2 + 8),(string *)local_98);
            std::__cxx11::string::operator=
                      ((string *)local_98,(string *)(path_2.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(path_2.field_2._M_local_buf + 8));
            cmsys::SystemTools::ConvertToUnixSlashes((string *)local_98);
            SetHomeOutputDirectory(this,(string *)local_98);
            bVar1 = false;
          }
          else {
            arg._0_4_ = (uint)arg + 1;
            sVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(args);
            if ((uint)arg < sVar6) {
              pvVar9 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)(uint)arg);
              std::__cxx11::string::operator=((string *)local_98,(string *)pvVar9);
              pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_98);
              if (*pcVar10 != '-') goto LAB_00386e72;
              cmSystemTools::Error
                        ("No build directory specified for -B",(char *)0x0,(char *)0x0,(char *)0x0);
              bVar1 = true;
            }
            else {
              cmSystemTools::Error
                        ("No build directory specified for -B",(char *)0x0,(char *)0x0,(char *)0x0);
              bVar1 = true;
            }
          }
          std::__cxx11::string::~string((string *)local_98);
          if (bVar1) {
            return;
          }
        }
        else {
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if (((ulong)(uint)arg < sVar6 - 2) &&
             (lVar7 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x85f89d), lVar7 == 0))
          {
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)((uint)arg + 1));
            std::__cxx11::string::operator=
                      ((string *)&this->CheckBuildSystemArgument,(string *)pvVar9);
            arg._0_4_ = (uint)arg + 2;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](args,(ulong)(uint)arg);
            pcVar10 = (char *)std::__cxx11::string::c_str();
            iVar5 = atoi(pcVar10);
            this->ClearBuildSystem = 0 < iVar5;
          }
          else {
            sVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(args);
            if (((ulong)(uint)arg < sVar6 - 1) &&
               (lVar7 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x85f8b2), lVar7 == 0)
               ) {
              arg._0_4_ = (uint)arg + 1;
              pvVar9 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)(uint)arg);
              std::__cxx11::string::operator=((string *)&this->CheckStampFile,(string *)pvVar9);
            }
            else {
              sVar6 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(args);
              if (((ulong)(uint)arg < sVar6 - 1) &&
                 (lVar7 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x85f8c5),
                 lVar7 == 0)) {
                arg._0_4_ = (uint)arg + 1;
                pvVar9 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,(ulong)(uint)arg);
                std::__cxx11::string::operator=((string *)&this->CheckStampList,(string *)pvVar9);
              }
              else {
                lVar7 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8455a5);
                if (lVar7 == 0) {
                  lVar7 = std::__cxx11::string::size();
                  if (lVar7 == 2) {
                    arg._0_4_ = (uint)arg + 1;
                  }
                }
                else {
                  lVar7 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8453ff);
                  if (lVar7 == 0) {
                    lVar7 = std::__cxx11::string::size();
                    if (lVar7 == 2) {
                      arg._0_4_ = (uint)arg + 1;
                    }
                  }
                  else {
                    lVar7 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x845287);
                    if (lVar7 == 0) {
                      lVar7 = std::__cxx11::string::size();
                      if (lVar7 == 2) {
                        arg._0_4_ = (uint)arg + 1;
                      }
                    }
                    else {
                      lVar7 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x85286b);
                      if (lVar7 == 0) {
                        arg._0_4_ = (uint)arg + 1;
                      }
                      else {
                        lVar7 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x85f78b);
                        if (lVar7 == 0) {
                          arg._0_4_ = (uint)arg + 1;
                        }
                        else {
                          lVar7 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8453b2);
                          if (lVar7 != 0) {
                            lVar7 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x85f8d8);
                            if (lVar7 == 0) {
                              std::__cxx11::string::substr((ulong)local_d8,path.field_2._8_8_);
                              cmsys::SystemTools::CollapseFullPath
                                        ((string *)((long)&file.field_2 + 8),(string *)local_d8);
                              std::__cxx11::string::operator=
                                        ((string *)local_d8,
                                         (string *)(file.field_2._M_local_buf + 8));
                              std::__cxx11::string::~string
                                        ((string *)(file.field_2._M_local_buf + 8));
                              cmsys::SystemTools::ConvertToUnixSlashes((string *)local_d8);
                              std::__cxx11::string::operator=
                                        ((string *)&this->GraphVizFile,(string *)local_d8);
                              uVar8 = std::__cxx11::string::empty();
                              if ((uVar8 & 1) != 0) {
                                cmSystemTools::Error
                                          ("No file specified for --graphviz",(char *)0x0,
                                           (char *)0x0,(char *)0x0);
                              }
                              std::__cxx11::string::~string((string *)local_d8);
                            }
                            else {
                              lVar7 = std::__cxx11::string::find
                                                ((char *)path.field_2._8_8_,0x85f905);
                              if (lVar7 == 0) {
                                std::operator<<((ostream *)&std::cout,"debug trycompile on\n");
                                DebugTryCompileOn(this);
                              }
                              else {
                                lVar7 = std::__cxx11::string::find
                                                  ((char *)path.field_2._8_8_,0x85f92d);
                                if (lVar7 == 0) {
                                  std::operator<<((ostream *)&std::cout,
                                                  "Running with debug output on.\n");
                                  SetDebugOutputOn(this,true);
                                }
                                else {
                                  lVar7 = std::__cxx11::string::find
                                                    ((char *)path.field_2._8_8_,0x85f95b);
                                  if (lVar7 == 0) {
                                    std::operator<<((ostream *)&std::cout,
                                                    "Running with expanded trace output on.\n");
                                    SetTrace(this,true);
                                    SetTraceExpand(this,true);
                                  }
                                  else {
                                    lVar7 = std::__cxx11::string::find
                                                      ((char *)path.field_2._8_8_,0x85f992);
                                    if (lVar7 == 0) {
                                      std::__cxx11::string::substr
                                                ((ulong)(&value.field_2._M_allocated_capacity + 1),
                                                 path.field_2._8_8_);
                                      cmsys::SystemTools::ConvertToUnixSlashes
                                                ((string *)
                                                 (&value.field_2._M_allocated_capacity + 1));
                                      AddTraceSource(this,(string *)((long)&value.field_2 + 8));
                                      SetTrace(this,true);
                                      std::__cxx11::string::~string
                                                ((string *)(value.field_2._M_local_buf + 8));
                                    }
                                    else {
                                      lVar7 = std::__cxx11::string::find
                                                        ((char *)path.field_2._8_8_,0x85f9a2);
                                      if (lVar7 == 0) {
                                        std::operator<<((ostream *)&std::cout,
                                                        "Running with trace output on.\n");
                                        SetTrace(this,true);
                                        SetTraceExpand(this,false);
                                      }
                                      else {
                                        lVar7 = std::__cxx11::string::find
                                                          ((char *)path.field_2._8_8_,0x85f9c9);
                                        if (lVar7 == 0) {
                                          std::operator<<((ostream *)&std::cout,
                                                          "Warn about uninitialized values.\n");
                                          SetWarnUninitialized(this,true);
                                        }
                                        else {
                                          lVar7 = std::__cxx11::string::find
                                                            ((char *)path.field_2._8_8_,0x85fa00);
                                          if (lVar7 == 0) {
                                            std::operator<<((ostream *)&std::cout,
                                                            "Finding unused variables.\n");
                                            SetWarnUnused(this,true);
                                          }
                                          else {
                                            lVar7 = std::__cxx11::string::find
                                                              ((char *)path.field_2._8_8_,0x85fa2e);
                                            if (lVar7 == 0) {
                                              poVar11 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                
                                                  "Not searching for unused variables given on the "
                                                  );
                                              std::operator<<(poVar11,"command line.\n");
                                              SetWarnUnusedCli(this,false);
                                            }
                                            else {
                                              lVar7 = std::__cxx11::string::find
                                                                ((char *)path.field_2._8_8_,0x85fa83
                                                                );
                                              if (lVar7 == 0) {
                                                poVar11 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                    
                                                  "Also check system files when warning about unused and "
                                                  );
                                                std::operator<<(poVar11,"uninitialized variables.\n"
                                                               );
                                                SetCheckSystemVars(this,true);
                                              }
                                              else {
                                                lVar7 = std::__cxx11::string::find
                                                                  ((char *)path.field_2._8_8_,
                                                                   0x85fb02);
                                                if (lVar7 == 0) {
                                                  std::__cxx11::string::substr
                                                            ((ulong)((long)&value_1.field_2 + 8),
                                                             path.field_2._8_8_);
                                                  uVar8 = std::__cxx11::string::empty();
                                                  if ((uVar8 & 1) == 0) {
LAB_00387682:
                                                    if (bVar2) {
                                                      cmSystemTools::Error
                                                                ("Multiple -A options not allowed",
                                                                 (char *)0x0,(char *)0x0,(char *)0x0
                                                                );
                                                      bVar1 = true;
                                                    }
                                                    else {
                                                      std::__cxx11::string::operator=
                                                                ((string *)&this->GeneratorPlatform,
                                                                 (string *)
                                                                 (value_1.field_2._M_local_buf + 8))
                                                      ;
                                                      bVar2 = true;
                                                      bVar1 = false;
                                                    }
                                                  }
                                                  else {
                                                    arg._0_4_ = (uint)arg + 1;
                                                    sVar6 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  if ((uint)arg < sVar6) {
                                                    pvVar9 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,(ulong)(uint)arg);
                                                  std::__cxx11::string::operator=
                                                            ((string *)
                                                             (value_1.field_2._M_local_buf + 8),
                                                             (string *)pvVar9);
                                                  goto LAB_00387682;
                                                  }
                                                  cmSystemTools::Error
                                                            ("No platform specified for -A",
                                                             (char *)0x0,(char *)0x0,(char *)0x0);
                                                  bVar1 = true;
                                                  }
                                                  std::__cxx11::string::~string
                                                            ((string *)
                                                             (value_1.field_2._M_local_buf + 8));
                                                  if (bVar1) {
                                                    return;
                                                  }
                                                }
                                                else {
                                                  lVar7 = std::__cxx11::string::find
                                                                    ((char *)path.field_2._8_8_,
                                                                     0x85fb3e);
                                                  if (lVar7 != 0) {
                                                    lVar7 = std::__cxx11::string::find
                                                                      ((char *)path.field_2._8_8_,
                                                                       0x85fb7c);
                                                    if (lVar7 != 0) {
                                                      pcVar10 = (char *)std::__cxx11::string::c_str
                                                                                  ();
                                                      SetDirectoriesFromFile(this,pcVar10);
                                                      goto LAB_00387aec;
                                                    }
                                                    std::__cxx11::string::substr
                                                              ((ulong)&gen,path.field_2._8_8_);
                                                    uVar8 = std::__cxx11::string::empty();
                                                    if ((uVar8 & 1) == 0) {
LAB_00387916:
                                                      kdevError.field_2._8_8_ =
                                                           CreateGlobalGenerator
                                                                     (this,(string *)&gen);
                                                      if ((cmGlobalGenerator *)
                                                          kdevError.field_2._8_8_ ==
                                                          (cmGlobalGenerator *)0x0) {
                                                        std::__cxx11::string::string
                                                                  ((string *)local_1a0);
                                                        lVar7 = std::__cxx11::string::find
                                                                          ((char *)&gen,0x85fb7f);
                                                        if (lVar7 != -1) {
                                                          std::__cxx11::string::operator=
                                                                    ((string *)local_1a0,
                                                                                                                                          
                                                  "\nThe KDevelop3 generator is not supported anymore."
                                                  );
                                                  }
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1e0,"Could not create named generator ",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gen);
                                                  std::operator+(&local_1c0,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1e0,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1a0);
                                                  cmSystemTools::Error(&local_1c0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1c0);
                                                  std::__cxx11::string::~string((string *)local_1e0)
                                                  ;
                                                  PrintGeneratorList(this);
                                                  std::__cxx11::string::~string((string *)local_1a0)
                                                  ;
                                                  }
                                                  else {
                                                    SetGlobalGenerator(this,(cmGlobalGenerator *)
                                                                            kdevError.field_2._8_8_)
                                                    ;
                                                  }
                                                  bVar1 = false;
                                                  }
                                                  else {
                                                    arg._0_4_ = (uint)arg + 1;
                                                    sVar6 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  if ((uint)arg < sVar6) {
                                                    pvVar9 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,(ulong)(uint)arg);
                                                  std::__cxx11::string::operator=
                                                            ((string *)&gen,(string *)pvVar9);
                                                  goto LAB_00387916;
                                                  }
                                                  cmSystemTools::Error
                                                            ("No generator specified for -G",
                                                             (char *)0x0,(char *)0x0,(char *)0x0);
                                                  PrintGeneratorList(this);
                                                  bVar1 = true;
                                                  }
                                                  std::__cxx11::string::~string((string *)&gen);
                                                  if (bVar1) {
                                                    return;
                                                  }
                                                  goto LAB_00387aec;
                                                  }
                                                  std::__cxx11::string::substr
                                                            ((ulong)((long)&value_2.field_2 + 8),
                                                             path.field_2._8_8_);
                                                  uVar8 = std::__cxx11::string::empty();
                                                  if ((uVar8 & 1) == 0) {
LAB_003877cb:
                                                    if (bVar3) {
                                                      cmSystemTools::Error
                                                                ("Multiple -T options not allowed",
                                                                 (char *)0x0,(char *)0x0,(char *)0x0
                                                                );
                                                      bVar1 = true;
                                                    }
                                                    else {
                                                      std::__cxx11::string::operator=
                                                                ((string *)&this->GeneratorToolset,
                                                                 (string *)
                                                                 (value_2.field_2._M_local_buf + 8))
                                                      ;
                                                      bVar3 = true;
                                                      bVar1 = false;
                                                    }
                                                  }
                                                  else {
                                                    arg._0_4_ = (uint)arg + 1;
                                                    sVar6 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  if ((uint)arg < sVar6) {
                                                    pvVar9 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,(ulong)(uint)arg);
                                                  std::__cxx11::string::operator=
                                                            ((string *)
                                                             (value_2.field_2._M_local_buf + 8),
                                                             (string *)pvVar9);
                                                  goto LAB_003877cb;
                                                  }
                                                  cmSystemTools::Error
                                                            ("No toolset specified for -T",
                                                             (char *)0x0,(char *)0x0,(char *)0x0);
                                                  bVar1 = true;
                                                  }
                                                  std::__cxx11::string::~string
                                                            ((string *)
                                                             (value_2.field_2._M_local_buf + 8));
                                                  if (bVar1) {
                                                    return;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00387aec:
    arg._0_4_ = (uint)arg + 1;
  } while( true );
}

Assistant:

void cmake::SetArgs(const std::vector<std::string>& args)
{
  bool haveToolset = false;
  bool havePlatform = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-H", 0) == 0 || arg.find("-S", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No source directory specified for -S");
          return;
        }
        path = args[i];
        if (path[0] == '-') {
          cmSystemTools::Error("No source directory specified for -S");
          return;
        }
      }

      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeDirectory(path);
    } else if (arg.find("-O", 0) == 0) {
      // There is no local generate anymore.  Ignore -O option.
    } else if (arg.find("-B", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No build directory specified for -B");
          return;
        }
        path = args[i];
        if (path[0] == '-') {
          cmSystemTools::Error("No build directory specified for -B");
          return;
        }
      }

      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeOutputDirectory(path);
    } else if ((i < args.size() - 2) &&
               (arg.find("--check-build-system", 0) == 0)) {
      this->CheckBuildSystemArgument = args[++i];
      this->ClearBuildSystem = (atoi(args[++i].c_str()) > 0);
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-file", 0) == 0)) {
      this->CheckStampFile = args[++i];
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-list", 0) == 0)) {
      this->CheckStampList = args[++i];
    }
#if defined(CMAKE_HAVE_VS_GENERATORS)
    else if ((i < args.size() - 1) &&
             (arg.find("--vs-solution-file", 0) == 0)) {
      this->VSSolutionFile = args[++i];
    }
#endif
    else if (arg.find("-D", 0) == 0) {
      // skip for now
      // in case '-D var=val' is given, also skip the next
      // in case '-Dvar=val' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-U", 0) == 0) {
      // skip for now
      // in case '-U var' is given, also skip the next
      // in case '-Uvar' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-C", 0) == 0) {
      // skip for now
      // in case '-C path' is given, also skip the next
      // in case '-Cpath' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-P", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("--find-package", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("-W", 0) == 0) {
      // skip for now
    } else if (arg.find("--graphviz=", 0) == 0) {
      std::string path = arg.substr(strlen("--graphviz="));
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->GraphVizFile = path;
      if (this->GraphVizFile.empty()) {
        cmSystemTools::Error("No file specified for --graphviz");
      }
    } else if (arg.find("--debug-trycompile", 0) == 0) {
      std::cout << "debug trycompile on\n";
      this->DebugTryCompileOn();
    } else if (arg.find("--debug-output", 0) == 0) {
      std::cout << "Running with debug output on.\n";
      this->SetDebugOutputOn(true);
    } else if (arg.find("--trace-expand", 0) == 0) {
      std::cout << "Running with expanded trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(true);
    } else if (arg.find("--trace-source=", 0) == 0) {
      std::string file = arg.substr(strlen("--trace-source="));
      cmSystemTools::ConvertToUnixSlashes(file);
      this->AddTraceSource(file);
      this->SetTrace(true);
    } else if (arg.find("--trace", 0) == 0) {
      std::cout << "Running with trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(false);
    } else if (arg.find("--warn-uninitialized", 0) == 0) {
      std::cout << "Warn about uninitialized values.\n";
      this->SetWarnUninitialized(true);
    } else if (arg.find("--warn-unused-vars", 0) == 0) {
      std::cout << "Finding unused variables.\n";
      this->SetWarnUnused(true);
    } else if (arg.find("--no-warn-unused-cli", 0) == 0) {
      std::cout << "Not searching for unused variables given on the "
                << "command line.\n";
      this->SetWarnUnusedCli(false);
    } else if (arg.find("--check-system-vars", 0) == 0) {
      std::cout << "Also check system files when warning about unused and "
                << "uninitialized variables.\n";
      this->SetCheckSystemVars(true);
    } else if (arg.find("-A", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No platform specified for -A");
          return;
        }
        value = args[i];
      }
      if (havePlatform) {
        cmSystemTools::Error("Multiple -A options not allowed");
        return;
      }
      this->GeneratorPlatform = value;
      havePlatform = true;
    } else if (arg.find("-T", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No toolset specified for -T");
          return;
        }
        value = args[i];
      }
      if (haveToolset) {
        cmSystemTools::Error("Multiple -T options not allowed");
        return;
      }
      this->GeneratorToolset = value;
      haveToolset = true;
    } else if (arg.find("-G", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return;
        }
        value = args[i];
      }
      cmGlobalGenerator* gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        std::string kdevError;
        if (value.find("KDevelop3", 0) != std::string::npos) {
          kdevError = "\nThe KDevelop3 generator is not supported anymore.";
        }

        cmSystemTools::Error("Could not create named generator " + value +
                             kdevError);
        this->PrintGeneratorList();
      } else {
        this->SetGlobalGenerator(gen);
      }
    }
    // no option assume it is the path to the source or an existing build
    else {
      this->SetDirectoriesFromFile(arg.c_str());
    }
  }